

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Int_t *
Gia_SimAbsPerformOne
          (Gia_Man_t *pGia,word *pOffSet,word *pOnSet,Vec_Wrd_t *vSimsCands,int nWords,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Int_t *vResub_00;
  Gia_SimAbsMan_t *p_00;
  abctime aVar3;
  Gia_SimAbsMan_t *p;
  Vec_Int_t *vResub;
  abctime clk;
  int fVerbose_local;
  int nWords_local;
  Vec_Wrd_t *vSimsCands_local;
  word *pOnSet_local;
  word *pOffSet_local;
  Gia_Man_t *pGia_local;
  
  aVar2 = Abc_Clock();
  vResub_00 = Vec_IntAlloc(10);
  p_00 = Gia_SimAbsAlloc(pGia,pOffSet,pOnSet,vSimsCands,nWords,vResub_00,fVerbose);
  Gia_SimAbsInit(p_00);
  do {
    Gia_SimAbsSolve(p_00);
    iVar1 = Gia_SimAbsRefine(p_00);
  } while (iVar1 != 0);
  Gia_SimAbsFree(p_00);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Resubstitution time",aVar3 - aVar2);
  return vResub_00;
}

Assistant:

Vec_Int_t * Gia_SimAbsPerformOne( Gia_Man_t * pGia, word * pOffSet, word * pOnSet, Vec_Wrd_t * vSimsCands, int nWords, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vResub  = Vec_IntAlloc( 10 );
    Gia_SimAbsMan_t * p = Gia_SimAbsAlloc( pGia, pOffSet, pOnSet, vSimsCands, nWords, vResub, fVerbose );
    Gia_SimAbsInit( p );
    while ( 1 )
    {
        Gia_SimAbsSolve( p );
        if ( !Gia_SimAbsRefine( p ) )
            break;
    }
    Gia_SimAbsFree( p );
    Abc_PrintTime( 1, "Resubstitution time", Abc_Clock() - clk );
    return vResub;
}